

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *this_00;
  pointer ppcVar1;
  cmMakefile *makefile;
  cmGeneratorTarget *this_01;
  pointer pcVar2;
  size_t __n;
  TargetType TVar3;
  int iVar4;
  pointer ppcVar5;
  string *psVar6;
  string *psVar7;
  long lVar8;
  pointer ppcVar9;
  string targetName;
  string compiler;
  string fastTarget;
  char *in_stack_ffffffffffffff20;
  string local_c0;
  string *local_a0;
  cmExtraSublimeTextGenerator *local_98;
  cmGeneratedFileStream *local_90;
  MapSourceFileFlags *local_88;
  string local_80;
  string local_60;
  pointer local_40;
  pointer local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_98 = this;
  local_90 = fout;
  local_88 = sourceFileFlags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CMAKE_MAKE_PROGRAM","");
  local_a0 = cmMakefile::GetRequiredDefinition(mf,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if ((lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"all","");
    AppendTarget(local_98,local_90,&local_c0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (local_a0->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,local_88,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"clean","");
    AppendTarget(local_98,local_90,&local_c0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (local_a0->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,local_88,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    ppcVar5 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_40 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar5 != local_40) {
      do {
        this_00 = *ppcVar5;
        ppcVar9 = (this_00->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar1 = (this_00->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_38 = ppcVar5;
        if (ppcVar9 != ppcVar1) {
          makefile = this_00->Makefile;
          do {
            this_01 = *ppcVar9;
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            pcVar2 = (psVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar2,pcVar2 + psVar6->_M_string_length);
            TVar3 = cmGeneratorTarget::GetType(this_01);
            if (TVar3 < UTILITY) {
              AppendTarget(local_98,local_90,&local_c0,this_00,this_01,(local_a0->_M_dataplus)._M_p,
                           makefile,in_stack_ffffffffffffff20,local_88,false);
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,local_c0._M_dataplus._M_p,
                         local_c0._M_dataplus._M_p + local_c0._M_string_length);
              std::__cxx11::string::append((char *)&local_60);
              AppendTarget(local_98,local_90,&local_60,this_00,this_01,(local_a0->_M_dataplus)._M_p,
                           makefile,in_stack_ffffffffffffff20,local_88,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else if (TVar3 == UTILITY) {
              lVar8 = std::__cxx11::string::find((char *)&local_c0,0x4f627e,0);
              if (((lVar8 != 0) ||
                  (iVar4 = std::__cxx11::string::compare((char *)&local_c0), iVar4 == 0)) &&
                 ((lVar8 = std::__cxx11::string::find((char *)&local_c0,0x4f6286,0), lVar8 != 0 ||
                  (iVar4 = std::__cxx11::string::compare((char *)&local_c0), iVar4 == 0)))) {
                lVar8 = std::__cxx11::string::find((char *)&local_c0,0x4f6291,0);
                if (lVar8 == 0) {
                  iVar4 = std::__cxx11::string::compare((char *)&local_c0);
LAB_002ff241:
                  if (iVar4 != 0) goto LAB_002ff2b2;
                }
LAB_002ff245:
                AppendTarget(local_98,local_90,&local_c0,this_00,(cmGeneratorTarget *)0x0,
                             (local_a0->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff20,
                             local_88,false);
              }
            }
            else if (TVar3 == GLOBAL_TARGET) {
              psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
              psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
              __n = psVar6->_M_string_length;
              if (__n == psVar7->_M_string_length) {
                if (__n != 0) {
                  iVar4 = bcmp((psVar6->_M_dataplus)._M_p,(psVar7->_M_dataplus)._M_p,__n);
                  goto LAB_002ff241;
                }
                goto LAB_002ff245;
              }
            }
LAB_002ff2b2:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            ppcVar9 = ppcVar9 + 1;
          } while (ppcVar9 != ppcVar1);
        }
        ppcVar5 = local_38 + 1;
      } while (ppcVar5 != local_40);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, lg, target, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}